

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

void lest::inform(location *where,text *expr)

{
  undefined8 uVar1;
  void *unaff_RBP;
  char unaff_R12B;
  void *unaff_R13;
  void *local_1f8;
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  undefined1 *local_1b8;
  undefined1 local_1a8 [16];
  undefined1 *local_198;
  undefined1 local_188 [48];
  void *local_158;
  location *local_108;
  message local_a8;
  
  uVar1 = __cxa_rethrow();
  message::~message(&local_a8);
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  if (local_1f8 != unaff_RBP) {
    operator_delete(local_1f8);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_108 != where) {
    operator_delete(local_108);
  }
  if (local_158 != unaff_R13) {
    operator_delete(local_158);
  }
  if (unaff_R12B != '\0') {
    __cxa_free_exception();
  }
  __cxa_end_catch();
  _Unwind_Resume(uVar1);
}

Assistant:

inline void inform( location where, text expr )
{
    try
    {
        throw;
    }
    catch( failure const & )
    {
        throw;
    }
    catch( std::exception const & e )
    {
        throw unexpected( where, expr, with_message( e.what() ) ); \
    }
    catch(...)
    {
        throw unexpected( where, expr, "of unknown type" ); \
    }
}